

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.cpp
# Opt level: O3

void __thiscall
ser::FileFormat::Init
          (FileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (directory->_M_dataplus)._M_p + (int)directory->_M_string_length;
  do {
    pcVar1 = pcVar1 + -1;
  } while (*pcVar1 == '/');
  std::__cxx11::string::substr((ulong)&local_50,(ulong)directory);
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->directory_,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__cxx11::string::_M_assign((string *)&this->prefix_);
  this->pGlobalMetainfo_ = globalMetainfo;
  this->pFieldsTable_ = fieldsTable;
  this->pOffsetTable_ = offsetTable;
  return;
}

Assistant:

void FileFormat::Init (const std::string& directory, const std::string& prefix,
                       MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    // Remove trailing /
    int size = directory.size();
    while (directory[size-1] == '/')
        --size;

    directory_ = directory.substr(0, size) + '/';
    prefix_ = prefix;
    pGlobalMetainfo_ = &globalMetainfo;
    pFieldsTable_ = &fieldsTable;
    pOffsetTable_ = &offsetTable;
}